

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse-5-defs.cpp
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::parseDefinitions
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *decls,Lexer *input,
          IndexMap *typeIndices,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          *implicitTypes,
          unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
          *typeNames)

{
  ParseDefsCtx *this;
  uint uVar1;
  Err *pEVar2;
  size_type sVar3;
  reference this_00;
  pointer func;
  reference pvVar4;
  reference puVar5;
  bool bVar6;
  Ok local_639;
  Err local_638;
  Err *local_618;
  Err *err_9;
  MaybeResult<wasm::Ok> _val_8;
  MaybeResult<wasm::Ok> parsed_1;
  WithPosition<wasm::WATParser::ParseDefsCtx> with_1;
  iterator iStack_590;
  uint pos;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Err local_558;
  string *local_538;
  Err *err_8;
  Result<wasm::Ok> end;
  Err *err_7;
  MaybeResult<wasm::Ok> _val_7;
  MaybeResult<wasm::Ok> im;
  Err *err_6;
  MaybeResult<wasm::Ok> _val_6;
  MaybeResult<wasm::Ok> parsed;
  Err *err_5;
  Result<wasm::Ok> _val_5;
  WithPosition<wasm::WATParser::ParseDefsCtx> with;
  Function *f;
  undefined1 local_390 [4];
  Index i;
  Err *local_370;
  Err *err_4;
  Result<wasm::Ok> _val_4;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Err local_248;
  Err *local_228;
  Err *err;
  undefined1 local_210 [8];
  Result<wasm::Ok> _val;
  ParseDefsCtx ctx;
  unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
  *implicitTypes_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  IndexMap *typeIndices_local;
  Lexer *input_local;
  ParseDeclsCtx *decls_local;
  
  this = (ParseDefsCtx *)
         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  ctx.irBuilder._152_8_ = implicitTypes;
  ParseDefsCtx::ParseDefsCtx
            (this,input,decls->wasm,types,implicitTypes,typeNames,&decls->implicitElemIndices,
             typeIndices);
  parseDefs<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::Ok> *)local_210,this,&decls->tableDefs,
             table<wasm::WATParser::ParseDefsCtx>);
  local_228 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_210);
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = local_228 != (Err *)0x0;
  if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_248,local_228);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_248);
    wasm::Err::~Err(&local_248);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_210);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
    parseDefs<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::Ok> *)&err_1,
               (ParseDefsCtx *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&decls->globalDefs,
               global<wasm::WATParser::ParseDefsCtx>);
    pEVar2 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    if (pEVar2 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar2);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar2 != (Err *)0x0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
      parseDefs<wasm::WATParser::ParseDefsCtx>
                ((Result<wasm::Ok> *)&err_2,
                 (ParseDefsCtx *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&decls->startDefs,
                 start<wasm::WATParser::ParseDefsCtx>);
      pEVar2 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      if (pEVar2 != (Err *)0x0) {
        wasm::Err::Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar2);
        Result<wasm::Ok>::Result
                  (__return_storage_ptr__,
                   (Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        wasm::Err::~Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar2 != (Err *)0x0;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        parseDefs<wasm::WATParser::ParseDefsCtx>
                  ((Result<wasm::Ok> *)&err_3,
                   (ParseDefsCtx *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&decls->elemDefs,
                   elem<wasm::WATParser::ParseDefsCtx>);
        pEVar2 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
        if (pEVar2 != (Err *)0x0) {
          wasm::Err::Err((Err *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar2);
          Result<wasm::Ok>::Result
                    (__return_storage_ptr__,
                     (Err *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar2 != (Err *)0x0;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
        if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
          parseDefs<wasm::WATParser::ParseDefsCtx>
                    ((Result<wasm::Ok> *)&err_4,
                     (ParseDefsCtx *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&decls->dataDefs,
                     data<wasm::WATParser::ParseDefsCtx>);
          local_370 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_4);
          bVar6 = local_370 != (Err *)0x0;
          if (bVar6) {
            wasm::Err::Err((Err *)local_390,local_370);
            Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)local_390);
            wasm::Err::~Err((Err *)local_390);
          }
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar6;
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_4);
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
            for (f._4_4_ = 0;
                sVar3 = std::
                        vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
                        size(&decls->funcDefs), f._4_4_ < sVar3; f._4_4_ = f._4_4_ + 1) {
              ctx.debugFileIndices._M_h._M_single_bucket._0_4_ = f._4_4_;
              this_00 = std::
                        vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ::operator[](&decls->wasm->functions,(ulong)f._4_4_);
              func = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                               (this_00);
              pvVar4 = std::
                       vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
                       operator[](&decls->funcDefs,(ulong)f._4_4_);
              WithPosition<wasm::WATParser::ParseDefsCtx>::WithPosition
                        ((WithPosition<wasm::WATParser::ParseDefsCtx> *)
                         ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                         (ParseDefsCtx *)
                         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pvVar4->pos);
              pvVar4 = std::
                       vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
                       operator[](&decls->funcDefs,(ulong)f._4_4_);
              ParseDefsCtx::setSrcLoc
                        ((ParseDefsCtx *)
                         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                         &pvVar4->annotations);
              bVar6 = Importable::imported(&func->super_Importable);
              if (bVar6) {
LAB_02480198:
                func<wasm::WATParser::ParseDefsCtx>
                          ((MaybeResult<wasm::Ok> *)
                           ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                           (ParseDefsCtx *)
                           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                bVar6 = wasm::MaybeResult::operator_cast_to_bool
                                  ((MaybeResult *)
                                   ((long)&_val_6.val.
                                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                   0x20));
                if (bVar6) {
                  MaybeResult<wasm::Ok>::MaybeResult
                            ((MaybeResult<wasm::Ok> *)&err_6,
                             (MaybeResult<wasm::Ok> *)
                             ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                            );
                  pEVar2 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_6);
                  if (pEVar2 != (Err *)0x0) {
                    wasm::Err::Err((Err *)((long)&im.val.
                                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                          + 0x20),pEVar2);
                    Result<wasm::Ok>::Result
                              (__return_storage_ptr__,
                               (Err *)((long)&im.val.
                                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                      + 0x20));
                    wasm::Err::~Err((Err *)((long)&im.val.
                                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           + 0x20));
                  }
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar2 != (Err *)0x0;
                  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_6);
                }
                else {
                  import_<wasm::WATParser::ParseDefsCtx>
                            ((MaybeResult<wasm::Ok> *)
                             ((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                             ,(ParseDefsCtx *)
                              ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  bVar6 = wasm::MaybeResult::operator_cast_to_bool
                                    ((MaybeResult *)
                                     ((long)&_val_7.val.
                                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                     + 0x20));
                  if (!bVar6) {
                    __assert_fail("im",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parse-5-defs.cpp"
                                  ,0x37,
                                  "Result<> wasm::WATParser::parseDefinitions(ParseDeclsCtx &, Lexer &, IndexMap &, std::vector<HeapType> &, std::unordered_map<Index, HeapType> &, std::unordered_map<HeapType, std::unordered_map<Name, Index>> &)"
                                 );
                  }
                  MaybeResult<wasm::Ok>::MaybeResult
                            ((MaybeResult<wasm::Ok> *)&err_7,
                             (MaybeResult<wasm::Ok> *)
                             ((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                            );
                  pEVar2 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_7);
                  if (pEVar2 != (Err *)0x0) {
                    wasm::Err::Err((Err *)((long)&end.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20
                                          ),pEVar2);
                    Result<wasm::Ok>::Result
                              (__return_storage_ptr__,
                               (Err *)((long)&end.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                    wasm::Err::~Err((Err *)((long)&end.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> +
                                           0x20));
                  }
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar2 != (Err *)0x0;
                  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_7);
                  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                  }
                  MaybeResult<wasm::Ok>::~MaybeResult
                            ((MaybeResult<wasm::Ok> *)
                             ((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                            );
                }
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                }
                MaybeResult<wasm::Ok>::~MaybeResult
                          ((MaybeResult<wasm::Ok> *)
                           ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  bVar6 = Importable::imported(&func->super_Importable);
                  if (!bVar6) {
                    IRBuilder::visitEnd((Result<wasm::Ok> *)&err_8,(IRBuilder *)&ctx.func);
                    local_538 = (string *)Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_8);
                    bVar6 = local_538 != (string *)0x0;
                    if (bVar6) {
                      pvVar4 = std::
                               vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                               ::operator[](&decls->funcDefs,(ulong)f._4_4_);
                      uVar1 = pvVar4->pos;
                      std::__cxx11::string::string((string *)&__range2,local_538);
                      Lexer::err(&local_558,(Lexer *)&ctx,(ulong)uVar1,(string *)&__range2);
                      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_558);
                      wasm::Err::~Err(&local_558);
                      std::__cxx11::string::~string((string *)&__range2);
                    }
                    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar6;
                    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_8);
                    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0)
                    goto LAB_02480639;
                  }
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                }
              }
              else {
                ParseDefsCtx::visitFunctionStart
                          ((Result<wasm::Ok> *)&err_5,
                           (ParseDefsCtx *)
                           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),func);
                pEVar2 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_5);
                if (pEVar2 != (Err *)0x0) {
                  wasm::Err::Err((Err *)((long)&parsed.val.
                                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                                .
                                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                .
                                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                .
                                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                .
                                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                        + 0x20),pEVar2);
                  Result<wasm::Ok>::Result
                            (__return_storage_ptr__,
                             (Err *)((long)&parsed.val.
                                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                            .super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                            .super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                    + 0x20));
                  wasm::Err::~Err((Err *)((long)&parsed.val.
                                                 super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                         + 0x20));
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar2 != (Err *)0x0;
                Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_5);
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0)
                goto LAB_02480198;
              }
LAB_02480639:
              WithPosition<wasm::WATParser::ParseDefsCtx>::~WithPosition
                        ((WithPosition<wasm::WATParser::ParseDefsCtx> *)
                         ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) goto LAB_024808eb;
            }
            __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (&decls->exportDefs);
            iStack_590 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   (&decls->exportDefs);
            while (bVar6 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffa70), bVar6) {
              puVar5 = __gnu_cxx::
                       __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator*(&__end2);
              WithPosition<wasm::WATParser::ParseDefsCtx>::WithPosition
                        ((WithPosition<wasm::WATParser::ParseDefsCtx> *)
                         ((long)&parsed_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                         (ParseDefsCtx *)
                         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),*puVar5);
              export_<wasm::WATParser::ParseDefsCtx>
                        ((MaybeResult<wasm::Ok> *)
                         ((long)&_val_8.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                         (ParseDefsCtx *)
                         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              MaybeResult<wasm::Ok>::MaybeResult
                        ((MaybeResult<wasm::Ok> *)&err_9,
                         (MaybeResult<wasm::Ok> *)
                         ((long)&_val_8.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
              local_618 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_9);
              bVar6 = local_618 != (Err *)0x0;
              if (bVar6) {
                wasm::Err::Err(&local_638,local_618);
                Result<wasm::Ok>::Result(__return_storage_ptr__,&local_638);
                wasm::Err::~Err(&local_638);
              }
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar6;
              MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_9);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                bVar6 = wasm::MaybeResult::operator_cast_to_bool
                                  ((MaybeResult *)
                                   ((long)&_val_8.val.
                                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                           .super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                   0x20));
                if (!bVar6) {
                  __assert_fail("parsed",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/parse-5-defs.cpp"
                                ,0x49,
                                "Result<> wasm::WATParser::parseDefinitions(ParseDeclsCtx &, Lexer &, IndexMap &, std::vector<HeapType> &, std::unordered_map<Index, HeapType> &, std::unordered_map<HeapType, std::unordered_map<Name, Index>> &)"
                               );
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
              }
              MaybeResult<wasm::Ok>::~MaybeResult
                        ((MaybeResult<wasm::Ok> *)
                         ((long)&_val_8.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
              WithPosition<wasm::WATParser::ParseDefsCtx>::~WithPosition
                        ((WithPosition<wasm::WATParser::ParseDefsCtx> *)
                         ((long)&parsed_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) goto LAB_024808eb;
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end2);
            }
            Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_639);
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
          }
        }
      }
    }
  }
LAB_024808eb:
  ParseDefsCtx::~ParseDefsCtx
            ((ParseDefsCtx *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> parseDefinitions(
  ParseDeclsCtx& decls,
  Lexer& input,
  IndexMap& typeIndices,
  std::vector<HeapType>& types,
  std::unordered_map<Index, HeapType>& implicitTypes,
  std::unordered_map<HeapType, std::unordered_map<Name, Index>>& typeNames) {
  // Parse definitions.
  // TODO: Parallelize this.
  ParseDefsCtx ctx(input,
                   decls.wasm,
                   types,
                   implicitTypes,
                   typeNames,
                   decls.implicitElemIndices,
                   typeIndices);
  CHECK_ERR(parseDefs(ctx, decls.tableDefs, table));
  CHECK_ERR(parseDefs(ctx, decls.globalDefs, global));
  CHECK_ERR(parseDefs(ctx, decls.startDefs, start));
  CHECK_ERR(parseDefs(ctx, decls.elemDefs, elem));
  CHECK_ERR(parseDefs(ctx, decls.dataDefs, data));

  for (Index i = 0; i < decls.funcDefs.size(); ++i) {
    ctx.index = i;
    auto* f = decls.wasm.functions[i].get();
    WithPosition with(ctx, decls.funcDefs[i].pos);
    ctx.setSrcLoc(decls.funcDefs[i].annotations);
    if (!f->imported()) {
      CHECK_ERR(ctx.visitFunctionStart(f));
    }
    if (auto parsed = func(ctx)) {
      CHECK_ERR(parsed);
    } else {
      auto im = import_(ctx);
      assert(im);
      CHECK_ERR(im);
    }
    if (!f->imported()) {
      auto end = ctx.irBuilder.visitEnd();
      if (auto* err = end.getErr()) {
        return ctx.in.err(decls.funcDefs[i].pos, err->msg);
      }
    }
  }

  // Parse exports.
  // TODO: It would be more technically correct to interleave these properly
  // with the implicit inline exports in other module field definitions.
  for (auto pos : decls.exportDefs) {
    WithPosition with(ctx, pos);
    auto parsed = export_(ctx);
    CHECK_ERR(parsed);
    assert(parsed);
  }
  return Ok{};
}